

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall
QGraphicsProxyWidgetPrivate::setWidget_helper
          (QGraphicsProxyWidgetPrivate *this,QWidget *newWidget,bool autoShow)

{
  QMarginsF margins;
  bool bVar1;
  uint uVar2;
  QObject *pQVar3;
  QWidget *pQVar4;
  QGraphicsItem **ppQVar5;
  QGraphicsItemPrivate *pQVar6;
  pointer pQVar7;
  QGraphicsProxyWidget **ppQVar8;
  QObject *pQVar9;
  QObject *pQVar10;
  byte in_DL;
  QObject *in_RSI;
  QGraphicsProxyWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsProxyWidget **proxyWidget;
  QWExtra *extra;
  unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *extra_1;
  QGraphicsProxyWidget *childProxy;
  QGraphicsItem *child;
  QList<QGraphicsItem_*> *__range2;
  QGraphicsProxyWidget *q;
  QSize sz;
  QWidget *parent;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QGraphicsItem_*> childItems;
  QWidget *in_stack_fffffffffffffdd8;
  QSizeF *size;
  QWidgetPrivate *in_stack_fffffffffffffde0;
  QWidget *in_stack_fffffffffffffde8;
  QWidget *in_stack_fffffffffffffdf0;
  QGraphicsProxyWidgetPrivate *this_00;
  QGraphicsProxyWidgetPrivate *in_stack_fffffffffffffdf8;
  QGraphicsItem *in_stack_fffffffffffffe00;
  QWidget *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe20;
  QObject *in_stack_fffffffffffffe28;
  QGraphicsItem *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe40;
  QWidget *in_stack_fffffffffffffe48;
  QGraphicsItem *local_198;
  pointer local_178;
  Connection local_138;
  QSizeF local_130;
  QSize local_120;
  QSizeF local_118;
  QSize local_104;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_fc;
  QMargins local_e0;
  QSizeF *local_d0;
  QWidget *local_c8;
  QWidget *local_c0;
  QGraphicsProxyWidgetPrivate *local_b8;
  QCursor local_b0;
  char local_a8 [32];
  char local_88 [32];
  QRectF local_68;
  QWidget *local_48;
  QGraphicsItem **local_40;
  const_iterator local_38;
  const_iterator local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QObject *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  pQVar3 = (QObject *)q_func(in_RDI);
  bVar1 = ::operator==((QWidget **)in_stack_fffffffffffffde0,
                       (QPointer<QWidget> *)in_stack_fffffffffffffdd8);
  if (!bVar1) {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9b9d1f);
    if (bVar1) {
      pQVar4 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9b9d3c);
      QObject::disconnect(&pQVar4->super_QObject,"2destroyed()",pQVar3,"1_q_removeWidgetSlot()");
      pQVar4 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b9d6e);
      QObject::removeEventFilter(&pQVar4->super_QObject);
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b9d92);
      QWidget::setAttribute
                (in_stack_fffffffffffffe48,
                 (WidgetAttribute)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffe40 >> 0x18,0));
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b9db5);
      QWidget::d_func((QWidget *)0x9b9dbd);
      pQVar7 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                         ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x9b9dc9);
      pQVar7->proxyWidget = (QGraphicsProxyWidget *)0x0;
      (*(in_RDI->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate._vptr_QGraphicsItemPrivate
        [5])(in_RDI,(ulong)(in_RDI->super_QGraphicsWidgetPrivate).inheritedFontResolveMask);
      (*(in_RDI->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate._vptr_QGraphicsItemPrivate
        [6])(in_RDI,(ulong)(in_RDI->super_QGraphicsWidgetPrivate).inheritedPaletteResolveMask);
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9b9e0d);
      QWidget::update(in_stack_fffffffffffffdd8);
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsItem::childItems((QGraphicsItem *)in_stack_fffffffffffffde8);
      local_30.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      local_30 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_stack_fffffffffffffde0);
      local_38.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_stack_fffffffffffffde0);
      while( true ) {
        local_40 = local_38.i;
        bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_30,local_38);
        if (!bVar1) break;
        ppQVar5 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_30);
        local_198 = *ppQVar5;
        pQVar6 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&local_198->d_ptr);
        uVar2 = (*pQVar6->_vptr_QGraphicsItemPrivate[7])();
        if ((uVar2 & 1) != 0) {
          if (local_198 == (QGraphicsItem *)0x0) {
            local_198 = (QGraphicsItem *)0x0;
          }
          else {
            local_198 = local_198 + -1;
          }
          local_48 = QGraphicsProxyWidget::widget((QGraphicsProxyWidget *)in_stack_fffffffffffffde0)
          ;
          while( true ) {
            bVar1 = false;
            if (local_48 != (QWidget *)0x0) {
              pQVar4 = QWidget::parentWidget((QWidget *)0x9b9fac);
              bVar1 = pQVar4 != (QWidget *)0x0;
            }
            if ((!bVar1) ||
               (bVar1 = ::operator==((QWidget **)in_stack_fffffffffffffde0,
                                     (QPointer<QWidget> *)in_stack_fffffffffffffdd8), bVar1)) break;
            local_48 = QWidget::parentWidget((QWidget *)0x9b9ff8);
          }
          pQVar4 = QGraphicsProxyWidget::widget((QGraphicsProxyWidget *)in_stack_fffffffffffffde0);
          if ((pQVar4 != (QWidget *)0x0) &&
             ((bVar1 = ::operator!=((QWidget **)in_stack_fffffffffffffde0,
                                    (QPointer<QWidget> *)in_stack_fffffffffffffdd8), !bVar1 &&
              (QGraphicsProxyWidget::setWidget
                         ((QGraphicsProxyWidget *)in_stack_fffffffffffffde0,
                          in_stack_fffffffffffffdd8), local_198 != (QGraphicsItem *)0x0)))) {
            (*local_198->_vptr_QGraphicsItem[4])();
          }
        }
        QList<QGraphicsItem_*>::const_iterator::operator++(&local_30);
      }
      QPointer<QWidget>::operator=
                ((QPointer<QWidget> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      QGraphicsItem::unsetCursor((QGraphicsItem *)in_stack_fffffffffffffe08);
      QGraphicsItem::setAcceptHoverEvents
                ((QGraphicsItem *)in_stack_fffffffffffffdf0,
                 SUB81((ulong)in_stack_fffffffffffffde8 >> 0x38,0));
      if (local_10 == (QObject *)0x0) {
        QRectF::QRectF(&local_68);
        QGraphicsItem::update(in_stack_fffffffffffffe00,(QRectF *)in_stack_fffffffffffffdf8);
      }
      QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9ba108);
    }
    if (local_10 != (QObject *)0x0) {
      bVar1 = QWidget::isWindow((QWidget *)in_stack_fffffffffffffde0);
      if (!bVar1) {
        QWidget::parentWidget((QWidget *)0x9ba14c);
        QWidget::d_func((QWidget *)0x9ba154);
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x9ba16d);
        if ((!bVar1) ||
           (pQVar7 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                               ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x9ba180),
           pQVar7->proxyWidget == (QGraphicsProxyWidget *)0x0)) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,
                     (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                     (char *)in_stack_fffffffffffffdd8);
          QMessageLogger::warning
                    (local_88,
                     "QGraphicsProxyWidget::setWidget: cannot embed widget %p which is not a toplevel widget, and is not a child of an embedded widget"
                     ,local_10);
          goto LAB_009ba850;
        }
      }
      QWidget::d_func((QWidget *)0x9ba1cf);
      local_178 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::get
                            ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x9ba1db);
      if (local_178 == (pointer)0x0) {
        QWidget::d_func((QWidget *)0x9ba1fb);
        QWidgetPrivate::createExtra(in_stack_fffffffffffffde0);
        QWidget::d_func((QWidget *)0x9ba210);
        local_178 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::get
                              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x9ba21c);
      }
      ppQVar8 = &local_178->proxyWidget;
      if (*ppQVar8 == (QGraphicsProxyWidget *)0x0) {
        *ppQVar8 = (QGraphicsProxyWidget *)pQVar3;
        QWidget::setAttribute
                  (in_stack_fffffffffffffe48,
                   (WidgetAttribute)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffe40 >> 0x18,0));
        QWidget::ensurePolished(in_stack_fffffffffffffe08);
        QWidget::setAttribute
                  (in_stack_fffffffffffffe48,
                   (WidgetAttribute)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffe40 >> 0x18,0));
        QGraphicsItem::setAcceptHoverEvents
                  ((QGraphicsItem *)in_stack_fffffffffffffdf0,
                   SUB81((ulong)in_stack_fffffffffffffde8 >> 0x38,0));
        bVar1 = QWidget::testAttribute
                          (in_stack_fffffffffffffde8,
                           (WidgetAttribute)((ulong)in_stack_fffffffffffffde0 >> 0x20));
        if (bVar1) {
          QGraphicsWidget::setAttribute
                    ((QWindow *)in_stack_fffffffffffffde0,
                     (WidgetAttribute)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x18,0));
        }
        bVar1 = QWidget::testAttribute
                          (in_stack_fffffffffffffde8,
                           (WidgetAttribute)((ulong)in_stack_fffffffffffffde0 >> 0x20));
        if (bVar1) {
          QGraphicsWidget::setAttribute
                    ((QWindow *)in_stack_fffffffffffffde0,
                     (WidgetAttribute)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x18,0));
        }
        QPointer<QWidget>::operator=
                  ((QPointer<QWidget> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        *(ushort *)&in_RDI->field_0x244 = *(ushort *)&in_RDI->field_0x244 & 0xff3f | 0x80;
        *(ushort *)&in_RDI->field_0x244 = *(ushort *)&in_RDI->field_0x244 & 0xffcf | 0x20;
        *(ushort *)&in_RDI->field_0x244 = *(ushort *)&in_RDI->field_0x244 & 0xfffc | 2;
        *(ushort *)&in_RDI->field_0x244 = *(ushort *)&in_RDI->field_0x244 & 0xfff3 | 8;
        if ((((in_DL & 1) != 0) &&
            (bVar1 = QWidget::testAttribute
                               (in_stack_fffffffffffffde8,
                                (WidgetAttribute)((ulong)in_stack_fffffffffffffde0 >> 0x20)), !bVar1
            )) || (bVar1 = QWidget::testAttribute
                                     (in_stack_fffffffffffffde8,
                                      (WidgetAttribute)((ulong)in_stack_fffffffffffffde0 >> 0x20)),
                  !bVar1)) {
          QWidget::show(in_stack_fffffffffffffdf0);
        }
        bVar1 = QWidget::testAttribute
                          (in_stack_fffffffffffffde8,
                           (WidgetAttribute)((ulong)in_stack_fffffffffffffde0 >> 0x20));
        if (bVar1) {
          QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9ba453);
          QWidget::cursor((QWidget *)in_stack_fffffffffffffdf8);
          QGraphicsItem::setCursor(in_stack_fffffffffffffe30,(QCursor *)in_stack_fffffffffffffe28);
          QCursor::~QCursor(&local_b0);
        }
        pQVar9 = pQVar3 + 0x10;
        QWidget::isEnabled((QWidget *)0x9ba4a0);
        QGraphicsItem::setEnabled
                  ((QGraphicsItem *)in_stack_fffffffffffffde0,
                   SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
        pQVar10 = pQVar3 + 0x10;
        QWidget::isVisible((QWidget *)0x9ba4ce);
        QGraphicsItem::setVisible
                  ((QGraphicsItem *)in_stack_fffffffffffffdf0,
                   SUB81((ulong)in_stack_fffffffffffffde8 >> 0x38,0));
        QWidget::layoutDirection((QWidget *)0x9ba4f8);
        QGraphicsWidget::setLayoutDirection
                  ((QWindow *)in_stack_fffffffffffffdf0,
                   (LayoutDirection)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        bVar1 = QWidget::testAttribute
                          (in_stack_fffffffffffffde8,
                           (WidgetAttribute)((ulong)in_stack_fffffffffffffde0 >> 0x20));
        if (bVar1) {
          in_stack_fffffffffffffe28 = pQVar3;
          QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9ba53d);
          QWidget::style(in_stack_fffffffffffffdd8);
          QGraphicsWidget::setStyle
                    ((QWindow *)in_stack_fffffffffffffde8,(QStyle *)in_stack_fffffffffffffde0);
        }
        (*(in_RDI->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.
          _vptr_QGraphicsItemPrivate[5])
                  (in_RDI,(ulong)(in_RDI->super_QGraphicsWidgetPrivate).inheritedFontResolveMask);
        (*(in_RDI->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.
          _vptr_QGraphicsItemPrivate[6])
                  (in_RDI,(ulong)(in_RDI->super_QGraphicsWidgetPrivate).inheritedPaletteResolveMask)
        ;
        bVar1 = QWidget::testAttribute
                          (in_stack_fffffffffffffde8,
                           (WidgetAttribute)((ulong)in_stack_fffffffffffffde0 >> 0x20));
        if (!bVar1) {
          QWidget::adjustSize((QWidget *)in_stack_fffffffffffffde0);
        }
        local_e0 = QWidget::contentsMargins((QWidget *)in_stack_fffffffffffffdf8);
        QMarginsF::QMarginsF
                  ((QMarginsF *)in_stack_fffffffffffffde0,(QMargins *)in_stack_fffffffffffffdd8);
        margins.m_top = (qreal)in_stack_fffffffffffffe28;
        margins.m_left = (qreal)in_stack_fffffffffffffe20;
        margins.m_right = (qreal)pQVar9;
        margins.m_bottom = (qreal)pQVar10;
        QGraphicsWidget::setContentsMargins((QWindow *)in_stack_fffffffffffffdf8,margins);
        QWidget::windowTitle(local_c0);
        QGraphicsWidget::setWindowTitle((QWindow *)local_b8,(QString *)local_c0);
        QString::~QString((QString *)0x9ba651);
        local_fc.bits = (Bits)QWidget::sizePolicy(local_c8);
        QGraphicsLayoutItem::setSizePolicy((QGraphicsLayoutItem *)local_b8,(QSizePolicy *)local_c0);
        local_104 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        local_104 = QWidget::minimumSize((QWidget *)local_b8);
        bVar1 = QSize::isNull((QSize *)local_b8);
        if (bVar1) {
          QSizeF::QSizeF(&local_118);
          size = local_d0;
          pQVar4 = local_c8;
          this_00 = local_b8;
        }
        else {
          QSizeF::QSizeF((QSizeF *)local_c8,(QSize *)local_d0);
          size = local_d0;
          pQVar4 = local_c8;
          this_00 = local_b8;
        }
        QGraphicsLayoutItem::setMinimumSize((QGraphicsLayoutItem *)pQVar4,size);
        local_120 = QWidget::maximumSize((QWidget *)this_00);
        local_104 = local_120;
        bVar1 = QSize::isNull((QSize *)this_00);
        if (bVar1) {
          QSizeF::QSizeF(&local_130);
        }
        else {
          QSizeF::QSizeF((QSizeF *)pQVar4,(QSize *)size);
        }
        QGraphicsLayoutItem::setMaximumSize((QGraphicsLayoutItem *)pQVar4,size);
        updateProxyGeometryFromWidget(in_stack_fffffffffffffdf8);
        updateProxyInputMethodAcceptanceFromWidget(this_00);
        QObject::installEventFilter(local_10);
        QObject::connect((QObject *)&local_138,(char *)local_10,(QObject *)"2destroyed()",
                         (char *)pQVar3,0xb44402);
        QMetaObject::Connection::~Connection(&local_138);
        *(ushort *)&in_RDI->field_0x244 = *(ushort *)&in_RDI->field_0x244 & 0xff3f;
        *(ushort *)&in_RDI->field_0x244 = *(ushort *)&in_RDI->field_0x244 & 0xffcf;
        *(ushort *)&in_RDI->field_0x244 = *(ushort *)&in_RDI->field_0x244 & 0xfffc;
        *(ushort *)&in_RDI->field_0x244 = *(ushort *)&in_RDI->field_0x244 & 0xfff3;
      }
      else if ((QObject *)*ppQVar8 != pQVar3) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,
                   (int)((ulong)in_stack_fffffffffffffde0 >> 0x20),(char *)in_stack_fffffffffffffdd8
                  );
        QMessageLogger::warning
                  (local_a8,
                   "QGraphicsProxyWidget::setWidget: cannot embed widget %p; already embedded",
                   local_10);
      }
    }
  }
LAB_009ba850:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidgetPrivate::setWidget_helper(QWidget *newWidget, bool autoShow)
{
    Q_Q(QGraphicsProxyWidget);
    if (newWidget == widget)
        return;
    if (widget) {
        QObject::disconnect(widget, SIGNAL(destroyed()), q, SLOT(_q_removeWidgetSlot()));
        widget->removeEventFilter(q);
        widget->setAttribute(Qt::WA_DontShowOnScreen, false);
        widget->d_func()->extra->proxyWidget = nullptr;
        resolveFont(inheritedFontResolveMask);
        resolvePalette(inheritedPaletteResolveMask);
        widget->update();

        const auto childItems = q->childItems();
        for (QGraphicsItem *child : childItems) {
            if (child->d_ptr->isProxyWidget()) {
                QGraphicsProxyWidget *childProxy = static_cast<QGraphicsProxyWidget *>(child);
                QWidget *parent = childProxy->widget();
                while (parent && parent->parentWidget()) {
                    if (parent == widget)
                        break;
                    parent = parent->parentWidget();
                }
                if (!childProxy->widget() || parent != widget)
                    continue;
                childProxy->setWidget(nullptr);
                delete childProxy;
            }
        }

        widget = nullptr;
#ifndef QT_NO_CURSOR
        q->unsetCursor();
#endif
        q->setAcceptHoverEvents(false);
        if (!newWidget)
            q->update();
    }
    if (!newWidget)
        return;
    if (!newWidget->isWindow()) {
        const auto &extra = newWidget->parentWidget()->d_func()->extra;
        if (!extra || !extra->proxyWidget)  {
            qWarning("QGraphicsProxyWidget::setWidget: cannot embed widget %p "
                     "which is not a toplevel widget, and is not a child of an embedded widget", newWidget);
            return;
        }
    }

    // Register this proxy within the widget's private.
    // ### This is a bit backdoorish
    QWExtra *extra = newWidget->d_func()->extra.get();
    if (!extra) {
        newWidget->d_func()->createExtra();
        extra = newWidget->d_func()->extra.get();
    }
    QGraphicsProxyWidget **proxyWidget = &extra->proxyWidget;
    if (*proxyWidget) {
        if (*proxyWidget != q) {
            qWarning("QGraphicsProxyWidget::setWidget: cannot embed widget %p"
                        "; already embedded", newWidget);
        }
        return;
    }
    *proxyWidget = q;

    newWidget->setAttribute(Qt::WA_DontShowOnScreen);
    newWidget->ensurePolished();
    // Do not wait for this widget to close before the app closes ###
    // shouldn't this widget inherit the attribute?
    newWidget->setAttribute(Qt::WA_QuitOnClose, false);
    q->setAcceptHoverEvents(true);

    if (newWidget->testAttribute(Qt::WA_NoSystemBackground))
        q->setAttribute(Qt::WA_NoSystemBackground);
    if (newWidget->testAttribute(Qt::WA_OpaquePaintEvent))
        q->setAttribute(Qt::WA_OpaquePaintEvent);

    widget = newWidget;

    // Changes only go from the widget to the proxy.
    enabledChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    visibleChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    posChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
    sizeChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;

    if ((autoShow && !newWidget->testAttribute(Qt::WA_WState_ExplicitShowHide)) || !newWidget->testAttribute(Qt::WA_WState_Hidden)) {
        newWidget->show();
    }

    // Copy the state from the widget onto the proxy.
#ifndef QT_NO_CURSOR
    if (newWidget->testAttribute(Qt::WA_SetCursor))
        q->setCursor(widget->cursor());
#endif
    q->setEnabled(newWidget->isEnabled());
    q->setVisible(newWidget->isVisible());
    q->setLayoutDirection(newWidget->layoutDirection());
    if (newWidget->testAttribute(Qt::WA_SetStyle))
        q->setStyle(widget->style());

    resolveFont(inheritedFontResolveMask);
    resolvePalette(inheritedPaletteResolveMask);

    if (!newWidget->testAttribute(Qt::WA_Resized))
        newWidget->adjustSize();

    q->setContentsMargins(newWidget->contentsMargins());
    q->setWindowTitle(newWidget->windowTitle());

    // size policies and constraints..
    q->setSizePolicy(newWidget->sizePolicy());
    QSize sz = newWidget->minimumSize();
    q->setMinimumSize(sz.isNull() ? QSizeF() : QSizeF(sz));
    sz = newWidget->maximumSize();
    q->setMaximumSize(sz.isNull() ? QSizeF() : QSizeF(sz));

    updateProxyGeometryFromWidget();

    updateProxyInputMethodAcceptanceFromWidget();

    // Hook up the event filter to keep the state up to date.
    newWidget->installEventFilter(q);
    QObject::connect(newWidget, SIGNAL(destroyed()), q, SLOT(_q_removeWidgetSlot()));

    // Changes no longer go only from the widget to the proxy.
    enabledChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    visibleChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    posChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
    sizeChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
}